

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap_iterator.hpp
# Opt level: O0

void __thiscall
burst::
bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>
::bitap_iterator(bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>
                 *this,searcher_type *bitap,text_range_type *text)

{
  const_iterator cVar1;
  const_iterator corpus_end;
  iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  iVar2;
  text_range_type *text_local;
  searcher_type *bitap_local;
  bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>
  *this_local;
  
  algorithm::
  bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
  ::bitap(&this->m_bitap,bitap);
  std::bitset<32UL>::bitset(&this->m_hint,0);
  cVar1 = std::forward_list<int,_std::allocator<int>_>::begin(text);
  corpus_end = std::forward_list<int,_std::allocator<int>_>::end(text);
  iVar2 = (iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
           )algorithm::
            bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
            ::find_first<std::_Fwd_list_const_iterator<int>>
                      ((bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
                        *)this,(_Fwd_list_const_iterator<int>)cVar1._M_node,
                       (_Fwd_list_const_iterator<int>)corpus_end._M_node,&this->m_hint);
  (this->m_match).
  super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
       = iVar2;
  cVar1 = std::forward_list<int,_std::allocator<int>_>::end(text);
  (this->m_text_end)._M_node = cVar1._M_node;
  return;
}

Assistant:

bitap_iterator (searcher_type bitap, const text_range_type & text):
            m_bitap(std::move(bitap)),
            m_hint(0b0),
            m_match(m_bitap.find_first(text.begin(), text.end(), m_hint)),
            m_text_end(text.end())
        {
        }